

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O2

Vec_Int_t * Cnf_ManWriteCnfMapping(Cnf_Man_t *p,Vec_Ptr_t *vMapped)

{
  char cVar1;
  int iVar2;
  uint __line;
  Vec_Int_t *p_00;
  void *pvVar3;
  ulong uVar4;
  int i;
  char *pcVar5;
  int nCap;
  
  nCap = p->pManAig->vObjs->nSize;
  p_00 = Vec_IntAlloc(nCap);
  p_00->nSize = nCap;
  if (p_00->pArray != (int *)0x0) {
    memset(p_00->pArray,0,(long)nCap << 2);
  }
  i = 0;
  while( true ) {
    if (vMapped->nSize <= i) {
      return p_00;
    }
    pvVar3 = Vec_PtrEntry(vMapped,i);
    if ((*(uint *)((long)pvVar3 + 0x18) & 7) - 7 < 0xfffffffe) break;
    pcVar5 = *(char **)((long)pvVar3 + 0x28);
    cVar1 = *pcVar5;
    if (4 < (long)cVar1) {
      pcVar5 = "pCut->nFanins < 5";
      __line = 0x39;
      goto LAB_00472e2f;
    }
    iVar2 = *(int *)((long)pvVar3 + 0x24);
    if (((long)iVar2 < 0) || (p_00->nSize <= iVar2)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    p_00->pArray[iVar2] = nCap;
    Vec_IntPush(p_00,*(int *)(pcVar5 + (long)cVar1 * 4 + 0x18));
    for (uVar4 = 0; (long)uVar4 < (long)*pcVar5; uVar4 = uVar4 + 1) {
      Vec_IntPush(p_00,*(int *)(pcVar5 + uVar4 * 4 + 0x18));
    }
    for (; (uint)uVar4 < 4; uVar4 = (ulong)((uint)uVar4 + 1)) {
      Vec_IntPush(p_00,-1);
    }
    nCap = nCap + 5;
    i = i + 1;
  }
  pcVar5 = "Aig_ObjIsNode(pObj)";
  __line = 0x37;
LAB_00472e2f:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                ,__line,"Vec_Int_t *Cnf_ManWriteCnfMapping(Cnf_Man_t *, Vec_Ptr_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Derives CNF mapping.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Cnf_ManWriteCnfMapping( Cnf_Man_t * p, Vec_Ptr_t * vMapped )
{
    Vec_Int_t * vResult;
    Aig_Obj_t * pObj;
    Cnf_Cut_t * pCut;
    int i, k, nOffset;
    nOffset = Aig_ManObjNumMax(p->pManAig);
    vResult = Vec_IntStart( nOffset );
    Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
    {
        assert( Aig_ObjIsNode(pObj) );
        pCut = Cnf_ObjBestCut( pObj );
        assert( pCut->nFanins < 5 );
        Vec_IntWriteEntry( vResult, Aig_ObjId(pObj), nOffset );
        Vec_IntPush( vResult, *Cnf_CutTruth(pCut) );
        for ( k = 0; k < pCut->nFanins; k++ )
            Vec_IntPush( vResult, pCut->pFanins[k] );
        for (      ; k < 4; k++ )
            Vec_IntPush( vResult, -1 );
        nOffset += 5;
    }
    return vResult;
}